

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

char * __thiscall cmTarget::GetProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  pointer pcVar1;
  bool bVar2;
  __type _Var3;
  TargetType TVar4;
  PolicyStatus PVar5;
  int iVar6;
  cmGlobalGenerator *pcVar7;
  cmGeneratorTarget *pcVar8;
  size_type sVar9;
  char *pcVar10;
  cmTargetInternals *pcVar11;
  pointer str1;
  size_type sVar12;
  cmSourceFile *this_00;
  cmSourceFileLocation *pcVar13;
  ostream *poVar14;
  cmState *this_01;
  PolicyID id;
  ostringstream *this_02;
  pointer arg;
  char *local_3a0;
  string objLibName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ostringstream e;
  char local_330 [360];
  string local_1c8;
  ostringstream e_1;
  size_type local_1a0;
  
  TVar4 = this->TargetTypeValue;
  if (TVar4 == INTERFACE_LIBRARY) {
    bVar2 = whiteListedInterfaceProperty(prop);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar14 = std::operator<<((ostream *)&e,
                                "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \""
                               );
      poVar14 = std::operator<<(poVar14,(string *)prop);
      std::operator<<(poVar14,"\" is not allowed.");
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(context,FATAL_ERROR,(string *)&e_1,false);
      std::__cxx11::string::~string((string *)&e_1);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return (char *)0x0;
    }
    TVar4 = this->TargetTypeValue;
  }
  if ((TVar4 < (UNKNOWN_LIBRARY|STATIC_LIBRARY)) && ((0x10fU >> (TVar4 & 0x1f) & 1) != 0)) {
    if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_ == '\0') &&
       (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                     propLOCATION_abi_cxx11_), iVar6 != 0)) {
      std::__cxx11::string::string
                ((string *)
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
                 "LOCATION",(allocator *)&e);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                           propLOCATION_abi_cxx11_);
    }
    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propLOCATION_abi_cxx11_);
    if (_Var3) {
      bVar2 = HandleLocationPropertyPolicy(this,context);
      if (!bVar2) {
        return (char *)0x0;
      }
      if (this->IsImportedTarget != true) {
        pcVar7 = cmMakefile::GetGlobalGenerator(this->Makefile);
        cmGlobalGenerator::CreateGenerationObjects(pcVar7,AllTargets);
        pcVar8 = cmGlobalGenerator::FindGeneratorTarget(pcVar7,&this->Name);
        pcVar10 = cmGeneratorTarget::GetLocationForBuild(pcVar8);
        cmPropertyMap::SetProperty
                  (&this->Properties,
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
                   pcVar10);
        goto LAB_0036d6a4;
      }
      std::__cxx11::string::string((string *)&e_1,"",(allocator *)&objLibName);
      ImportedGetFullPath((string *)&e,this,(string *)&e_1,false);
      cmPropertyMap::SetProperty
                (&this->Properties,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,_e);
LAB_0036d615:
      std::__cxx11::string::~string((string *)&e);
      this_02 = &e_1;
    }
    else {
      bVar2 = cmHasLiteralPrefix<std::__cxx11::string,10ul>(prop,(char (*) [10])0x5466e3);
      if (bVar2) {
        bVar2 = HandleLocationPropertyPolicy(this,context);
        if (!bVar2) {
          return (char *)0x0;
        }
        pcVar10 = (prop->_M_dataplus)._M_p + 9;
        if (this->IsImportedTarget == true) {
          std::__cxx11::string::string((string *)&e_1,pcVar10,(allocator *)&objLibName);
          ImportedGetFullPath((string *)&e,this,(string *)&e_1,false);
          cmPropertyMap::SetProperty(&this->Properties,prop,_e);
        }
        else {
          pcVar7 = cmMakefile::GetGlobalGenerator(this->Makefile);
          cmGlobalGenerator::CreateGenerationObjects(pcVar7,AllTargets);
          pcVar8 = cmGlobalGenerator::FindGeneratorTarget(pcVar7,&this->Name);
          std::__cxx11::string::string((string *)&e_1,pcVar10,(allocator *)&objLibName);
          cmGeneratorTarget::GetFullPath((string *)&e,pcVar8,(string *)&e_1,false,false);
          cmPropertyMap::SetProperty(&this->Properties,prop,_e);
        }
        goto LAB_0036d615;
      }
      bVar2 = cmHasLiteralSuffix<std::__cxx11::string,10ul>(prop,(char (*) [10])0x5466c0);
      if (!bVar2) goto LAB_0036d6a4;
      pcVar1 = (prop->_M_dataplus)._M_p;
      _e = local_330;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&e,pcVar1,pcVar1 + (prop->_M_string_length - 9));
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &e,"IMPORTED");
      if (bVar2) {
        bVar2 = HandleLocationPropertyPolicy(this,context);
        if (!bVar2) {
          std::__cxx11::string::~string((string *)&e);
          return (char *)0x0;
        }
        if (this->IsImportedTarget == true) {
          ImportedGetFullPath((string *)&e_1,this,(string *)&e,false);
          cmPropertyMap::SetProperty(&this->Properties,prop,_e_1);
        }
        else {
          pcVar7 = cmMakefile::GetGlobalGenerator(this->Makefile);
          cmGlobalGenerator::CreateGenerationObjects(pcVar7,AllTargets);
          pcVar8 = cmGlobalGenerator::FindGeneratorTarget(pcVar7,&this->Name);
          cmGeneratorTarget::GetFullPath((string *)&e_1,pcVar8,(string *)&e,false,false);
          cmPropertyMap::SetProperty(&this->Properties,prop,_e_1);
        }
        std::__cxx11::string::~string((string *)&e_1);
      }
      this_02 = &e;
    }
    std::__cxx11::string::~string((string *)this_02);
  }
LAB_0036d6a4:
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   specialProps_abi_cxx11_), iVar6 != 0)) {
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::hash_set(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_);
    __cxa_atexit(cmsys::
                 hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                 ::~hash_set,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         specialProps_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLINK_LIBRARIES_abi_cxx11_ == '\0')
     && (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                      propLINK_LIBRARIES_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLINK_LIBRARIES_abi_cxx11_,
               "LINK_LIBRARIES",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propLINK_LIBRARIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propLINK_LIBRARIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propTYPE_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_,
               "TYPE",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propINCLUDE_DIRECTORIES_abi_cxx11_ ==
       '\0') &&
     (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propINCLUDE_DIRECTORIES_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propINCLUDE_DIRECTORIES_abi_cxx11_,"INCLUDE_DIRECTORIES",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propINCLUDE_DIRECTORIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_FEATURES_abi_cxx11_ == '\0'
      ) && (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         propCOMPILE_FEATURES_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propCOMPILE_FEATURES_abi_cxx11_,"COMPILE_FEATURES",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_FEATURES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_FEATURES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_OPTIONS_abi_cxx11_ == '\0')
     && (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                      propCOMPILE_OPTIONS_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_OPTIONS_abi_cxx11_
               ,"COMPILE_OPTIONS",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_OPTIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_OPTIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_DEFINITIONS_abi_cxx11_ ==
       '\0') &&
     (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propCOMPILE_DEFINITIONS_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propCOMPILE_DEFINITIONS_abi_cxx11_,"COMPILE_DEFINITIONS",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_DEFINITIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_DEFINITIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propIMPORTED_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_,
               "IMPORTED",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propIMPORTED_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propNAME_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_,
               "NAME",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propBINARY_DIR_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propBINARY_DIR_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propBINARY_DIR_abi_cxx11_,
               "BINARY_DIR",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propBINARY_DIR_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propBINARY_DIR_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCE_DIR_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propSOURCE_DIR_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCE_DIR_abi_cxx11_,
               "SOURCE_DIR",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCE_DIR_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propSOURCE_DIR_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propSOURCES_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_,
               "SOURCES",(allocator *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propSOURCES_abi_cxx11_);
  }
  if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
      _M_num_elements == 0) {
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLINK_LIBRARIES_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
              propINCLUDE_DIRECTORIES_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_FEATURES_abi_cxx11_)
    ;
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_OPTIONS_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
              propCOMPILE_DEFINITIONS_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propBINARY_DIR_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCE_DIR_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)&e,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_);
  }
  sVar9 = cmsys::
          hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::count(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_.
                   _M_ht,prop);
  if (sVar9 != 0) {
    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propLINK_LIBRARIES_abi_cxx11_);
    if (_Var3) {
      pcVar11 = (this->Internal).Pointer;
      if ((pcVar11->LinkImplementationPropertyEntries).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pcVar11->LinkImplementationPropertyEntries).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
           (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         output_abi_cxx11_), iVar6 != 0)) {
          GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus._M_p =
               (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                         field_2;
          GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_string_length =
               0;
          GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.field_2.
          _M_local_buf[0] = '\0';
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                               output_abi_cxx11_);
        }
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((string *)&e,&((this->Internal).Pointer)->LinkImplementationPropertyEntries,";");
        std::__cxx11::string::operator=
                  ((string *)
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                   (string *)&e);
        std::__cxx11::string::~string((string *)&e);
        return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus.
               _M_p;
      }
    }
    else {
      _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                    propTYPE_abi_cxx11_);
      if (_Var3) {
        pcVar10 = cmState::GetTargetTypeName(this->TargetTypeValue);
        return pcVar10;
      }
      _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                    propINCLUDE_DIRECTORIES_abi_cxx11_);
      if (_Var3) {
        pcVar11 = (this->Internal).Pointer;
        if ((pcVar11->IncludeDirectoriesEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pcVar11->IncludeDirectoriesEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
             (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                           output_abi_cxx11_), iVar6 != 0)) {
            GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus._M_p
                 = (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_
                             .field_2;
            GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_string_length
                 = 0;
            GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.field_2.
            _M_local_buf[0] = '\0';
            __cxa_atexit(std::__cxx11::string::~string,
                         &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                         &__dso_handle);
            __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                 output_abi_cxx11_);
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)&e,&((this->Internal).Pointer)->IncludeDirectoriesEntries,";");
          std::__cxx11::string::operator=
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                     (string *)&e);
          std::__cxx11::string::~string((string *)&e);
          return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus
                 ._M_p;
        }
      }
      else {
        _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                      propCOMPILE_FEATURES_abi_cxx11_);
        if (_Var3) {
          pcVar11 = (this->Internal).Pointer;
          if ((pcVar11->CompileFeaturesEntries).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pcVar11->CompileFeaturesEntries).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
               (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                             output_abi_cxx11_), iVar6 != 0)) {
              GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus.
              _M_p = (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                               output_abi_cxx11_.field_2;
              GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
              _M_string_length = 0;
              GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.field_2.
              _M_local_buf[0] = '\0';
              __cxa_atexit(std::__cxx11::string::~string,
                           &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                           &__dso_handle);
              __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   output_abi_cxx11_);
            }
            cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((string *)&e,&((this->Internal).Pointer)->CompileFeaturesEntries,";");
            std::__cxx11::string::operator=
                      ((string *)
                       &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                       (string *)&e);
            std::__cxx11::string::~string((string *)&e);
            return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                   _M_dataplus._M_p;
          }
        }
        else {
          _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                        propCOMPILE_OPTIONS_abi_cxx11_);
          if (_Var3) {
            pcVar11 = (this->Internal).Pointer;
            if ((pcVar11->CompileOptionsEntries).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pcVar11->CompileOptionsEntries).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0')
                 && (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)
                                                  ::output_abi_cxx11_), iVar6 != 0)) {
                GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus.
                _M_p = (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                 output_abi_cxx11_.field_2;
                GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                _M_string_length = 0;
                GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.field_2.
                _M_local_buf[0] = '\0';
                __cxa_atexit(std::__cxx11::string::~string,
                             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                              output_abi_cxx11_,&__dso_handle);
                __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                     output_abi_cxx11_);
              }
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((string *)&e,&((this->Internal).Pointer)->CompileOptionsEntries,";");
              std::__cxx11::string::operator=
                        ((string *)
                         &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                         (string *)&e);
              std::__cxx11::string::~string((string *)&e);
              return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                     _M_dataplus._M_p;
            }
          }
          else {
            _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                          propCOMPILE_DEFINITIONS_abi_cxx11_);
            if (!_Var3) {
              _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                            propIMPORTED_abi_cxx11_);
              if (_Var3) {
                if (this->IsImportedTarget != false) {
                  return "TRUE";
                }
                return "FALSE";
              }
              _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                            propNAME_abi_cxx11_);
              if (_Var3) {
                return (this->Name)._M_dataplus._M_p;
              }
              _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                            propBINARY_DIR_abi_cxx11_);
              if (_Var3) {
                pcVar10 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
                return pcVar10;
              }
              _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                            propSOURCE_DIR_abi_cxx11_);
              if (_Var3) {
                pcVar10 = cmMakefile::GetCurrentSourceDirectory(this->Makefile);
                return pcVar10;
              }
              _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                            propSOURCES_abi_cxx11_);
              if (_Var3) {
                pcVar11 = (this->Internal).Pointer;
                if ((pcVar11->SourceEntries).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    (pcVar11->SourceEntries).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  return (char *)0x0;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                pcVar11 = (this->Internal).Pointer;
                arg = (pcVar11->SourceEntries).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
                local_3a0 = "";
                for (; arg != (pcVar11->SourceEntries).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish; arg = arg + 1) {
                  files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  cmSystemTools::ExpandListArgument(arg,&files,false);
                  for (str1 = files.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                      str1 != files.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish; str1 = str1 + 1) {
                    bVar2 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                                      (str1,(char (*) [18])"$<TARGET_OBJECTS:");
                    if ((bVar2) && ((str1->_M_dataplus)._M_p[str1->_M_string_length - 1] == '>')) {
                      std::__cxx11::string::substr((ulong)&objLibName,(ulong)str1);
                      sVar12 = cmGeneratorExpression::Find(&objLibName);
                      if (sVar12 == 0xffffffffffffffff) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e_1);
                        PVar5 = cmMakefile::GetPolicyStatus(context,CMP0051);
                        if (PVar5 - NEW < 3) {
                          std::operator<<((ostream *)&e,local_3a0);
                          std::operator<<((ostream *)&e,(string *)str1);
                          local_3a0 = ";";
                        }
                        else if (PVar5 == WARN) {
                          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x33,id);
                          poVar14 = std::operator<<((ostream *)&e_1,(string *)&local_1c8);
                          std::operator<<(poVar14,"\n");
                          std::__cxx11::string::~string((string *)&local_1c8);
                          poVar14 = std::operator<<((ostream *)&e_1,"Target \"");
                          poVar14 = std::operator<<(poVar14,(string *)&this->Name);
                          std::operator<<(poVar14,
                                          "\" contains $<TARGET_OBJECTS> generator expression in its sources list.  This content was not previously part of the SOURCES property when that property was read at configure time.  Code reading that property needs to be adapted to ignore the generator expression using the string(GENEX_STRIP) command."
                                         );
                          std::__cxx11::stringbuf::str();
                          cmMakefile::IssueMessage(context,AUTHOR_WARNING,&local_1c8,false);
                          std::__cxx11::string::~string((string *)&local_1c8);
                        }
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e_1);
                      }
                      else {
                        std::operator<<((ostream *)&e,local_3a0);
                        std::operator<<((ostream *)&e,(string *)str1);
                        local_3a0 = ";";
                      }
                      std::__cxx11::string::~string((string *)&objLibName);
                    }
                    else {
                      sVar12 = cmGeneratorExpression::Find(str1);
                      if (sVar12 == 0xffffffffffffffff) {
                        std::operator<<((ostream *)&e,local_3a0);
                        std::operator<<((ostream *)&e,(string *)str1);
                        local_3a0 = ";";
                      }
                      else {
                        this_00 = cmMakefile::GetOrCreateSource(this->Makefile,str1,false);
                        pcVar13 = cmSourceFile::GetLocation(this_00);
                        std::__cxx11::string::string((string *)&e_1,(string *)&pcVar13->Directory);
                        if (local_1a0 != 0) {
                          std::__cxx11::string::append((char *)&e_1);
                        }
                        std::__cxx11::string::append((string *)&e_1);
                        std::operator<<((ostream *)&e,local_3a0);
                        std::operator<<((ostream *)&e,(string *)&e_1);
                        std::__cxx11::string::~string((string *)&e_1);
                        local_3a0 = ";";
                      }
                    }
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&files);
                  pcVar11 = (this->Internal).Pointer;
                }
                std::__cxx11::string::string((string *)&e_1,"SOURCES",(allocator *)&local_1c8);
                std::__cxx11::stringbuf::str();
                cmPropertyMap::SetProperty
                          (&this->Properties,(string *)&e_1,objLibName._M_dataplus._M_p);
                std::__cxx11::string::~string((string *)&objLibName);
                std::__cxx11::string::~string((string *)&e_1);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
              }
              goto LAB_0036def5;
            }
            pcVar11 = (this->Internal).Pointer;
            if ((pcVar11->CompileDefinitionsEntries).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pcVar11->CompileDefinitionsEntries).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0')
                 && (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)
                                                  ::output_abi_cxx11_), iVar6 != 0)) {
                GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus.
                _M_p = (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                 output_abi_cxx11_.field_2;
                GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                _M_string_length = 0;
                GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.field_2.
                _M_local_buf[0] = '\0';
                __cxa_atexit(std::__cxx11::string::~string,
                             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                              output_abi_cxx11_,&__dso_handle);
                __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                     output_abi_cxx11_);
              }
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((string *)&e,&((this->Internal).Pointer)->CompileDefinitionsEntries,";");
              std::__cxx11::string::operator=
                        ((string *)
                         &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                         (string *)&e);
              std::__cxx11::string::~string((string *)&e);
              return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                     _M_dataplus._M_p;
            }
          }
        }
      }
    }
    return (char *)0x0;
  }
LAB_0036def5:
  pcVar10 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
  if (pcVar10 != (char *)0x0) {
    return pcVar10;
  }
  this_01 = cmMakefile::GetState(this->Makefile);
  bVar2 = cmState::IsPropertyChained(this_01,prop,TARGET);
  if (bVar2) {
    pcVar10 = cmMakefile::GetProperty(this->Makefile,prop,true);
    return pcVar10;
  }
  return (char *)0x0;
}

Assistant:

const char *cmTarget::GetProperty(const std::string& prop,
                                  cmMakefile* context) const
{
  if (this->GetType() == cmState::INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    context->IssueMessage(cmake::FATAL_ERROR, e.str());
    return 0;
    }

  // Watch for special "computed" properties that are dependent on
  // other properties or variables.  Always recompute them.
  if(this->GetType() == cmState::EXECUTABLE ||
     this->GetType() == cmState::STATIC_LIBRARY ||
     this->GetType() == cmState::SHARED_LIBRARY ||
     this->GetType() == cmState::MODULE_LIBRARY ||
     this->GetType() == cmState::UNKNOWN_LIBRARY)
    {
    static const std::string propLOCATION = "LOCATION";
    if(prop == propLOCATION)
      {
      if (!this->HandleLocationPropertyPolicy(context))
        {
        return 0;
        }

      // Set the LOCATION property of the target.
      //
      // For an imported target this is the location of an arbitrary
      // available configuration.
      //
      if(this->IsImported())
        {
        this->Properties.SetProperty(
                propLOCATION, this->ImportedGetFullPath("", false).c_str());
        }
      else
        {
        // For a non-imported target this is deprecated because it
        // cannot take into account the per-configuration name of the
        // target because the configuration type may not be known at
        // CMake time.
        cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
        gg->CreateGenerationObjects();
        cmGeneratorTarget* gt = gg->FindGeneratorTarget(this->GetName());
        this->Properties.SetProperty(propLOCATION,
                                     gt->GetLocationForBuild());
        }

      }

    // Support "LOCATION_<CONFIG>".
    else if(cmHasLiteralPrefix(prop, "LOCATION_"))
      {
      if (!this->HandleLocationPropertyPolicy(context))
        {
        return 0;
        }
      const char* configName = prop.c_str() + 9;

      if (this->IsImported())
        {
        this->Properties.SetProperty(
                prop, this->ImportedGetFullPath(configName, false).c_str());
        }
      else
        {
        cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
        gg->CreateGenerationObjects();
        cmGeneratorTarget* gt = gg->FindGeneratorTarget(this->GetName());
        this->Properties.SetProperty(
                prop, gt->GetFullPath(configName, false).c_str());
        }
      }
    // Support "<CONFIG>_LOCATION".
    else if(cmHasLiteralSuffix(prop, "_LOCATION"))
      {
      std::string configName(prop.c_str(), prop.size() - 9);
      if(configName != "IMPORTED")
        {
        if (!this->HandleLocationPropertyPolicy(context))
          {
          return 0;
          }
        if (this->IsImported())
          {
          this->Properties.SetProperty(
                  prop, this->ImportedGetFullPath(configName, false).c_str());
          }
        else
          {
          cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
          gg->CreateGenerationObjects();
          cmGeneratorTarget* gt = gg->FindGeneratorTarget(this->GetName());
          this->Properties.SetProperty(
                  prop, gt->GetFullPath(configName, false).c_str());
          }
        }
      }
    }
  static UNORDERED_SET<std::string> specialProps;
#define MAKE_STATIC_PROP(PROP) \
  static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(TYPE);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(IMPORTED);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(BINARY_DIR);
  MAKE_STATIC_PROP(SOURCE_DIR);
  MAKE_STATIC_PROP(SOURCES);
#undef MAKE_STATIC_PROP
  if(specialProps.empty())
    {
    specialProps.insert(propLINK_LIBRARIES);
    specialProps.insert(propTYPE);
    specialProps.insert(propINCLUDE_DIRECTORIES);
    specialProps.insert(propCOMPILE_FEATURES);
    specialProps.insert(propCOMPILE_OPTIONS);
    specialProps.insert(propCOMPILE_DEFINITIONS);
    specialProps.insert(propIMPORTED);
    specialProps.insert(propNAME);
    specialProps.insert(propBINARY_DIR);
    specialProps.insert(propSOURCE_DIR);
    specialProps.insert(propSOURCES);
    }
  if(specialProps.count(prop))
    {
    if(prop == propLINK_LIBRARIES)
      {
      if (this->Internal->LinkImplementationPropertyEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = cmJoin(this->Internal->LinkImplementationPropertyEntries, ";");
      return output.c_str();
      }
    // the type property returns what type the target is
    else if (prop == propTYPE)
      {
      return cmState::GetTargetTypeName(this->GetType());
      }
    else if(prop == propINCLUDE_DIRECTORIES)
      {
      if (this->Internal->IncludeDirectoriesEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = cmJoin(this->Internal->IncludeDirectoriesEntries, ";");
      return output.c_str();
      }
    else if(prop == propCOMPILE_FEATURES)
      {
      if (this->Internal->CompileFeaturesEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = cmJoin(this->Internal->CompileFeaturesEntries, ";");
      return output.c_str();
      }
    else if(prop == propCOMPILE_OPTIONS)
      {
      if (this->Internal->CompileOptionsEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = cmJoin(this->Internal->CompileOptionsEntries, ";");
      return output.c_str();
      }
    else if(prop == propCOMPILE_DEFINITIONS)
      {
      if (this->Internal->CompileDefinitionsEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = cmJoin(this->Internal->CompileDefinitionsEntries, ";");
      return output.c_str();
      }
    else if (prop == propIMPORTED)
      {
      return this->IsImported()?"TRUE":"FALSE";
      }
    else if (prop == propNAME)
      {
      return this->GetName().c_str();
      }
    else if (prop == propBINARY_DIR)
      {
      return this->GetMakefile()->GetCurrentBinaryDirectory();
      }
    else if (prop == propSOURCE_DIR)
      {
      return this->GetMakefile()->GetCurrentSourceDirectory();
      }
    else if(prop == propSOURCES)
      {
      if (this->Internal->SourceEntries.empty())
        {
        return 0;
        }

      std::ostringstream ss;
      const char* sep = "";
      for(std::vector<std::string>::const_iterator
            i = this->Internal->SourceEntries.begin();
          i != this->Internal->SourceEntries.end(); ++i)
        {
        std::string const& entry = *i;

        std::vector<std::string> files;
        cmSystemTools::ExpandListArgument(entry, files);
        for (std::vector<std::string>::const_iterator
            li = files.begin(); li != files.end(); ++li)
          {
          if(cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
              (*li)[li->size() - 1] == '>')
            {
            std::string objLibName = li->substr(17, li->size()-18);

            if (cmGeneratorExpression::Find(objLibName) != std::string::npos)
              {
              ss << sep;
              sep = ";";
              ss << *li;
              continue;
              }

            bool addContent = false;
            bool noMessage = true;
            std::ostringstream e;
            cmake::MessageType messageType = cmake::AUTHOR_WARNING;
            switch(context->GetPolicyStatus(cmPolicies::CMP0051))
              {
              case cmPolicies::WARN:
                e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
                noMessage = false;
              case cmPolicies::OLD:
                break;
              case cmPolicies::REQUIRED_ALWAYS:
              case cmPolicies::REQUIRED_IF_USED:
              case cmPolicies::NEW:
                addContent = true;
              }
            if (!noMessage)
              {
              e << "Target \"" << this->Name << "\" contains "
              "$<TARGET_OBJECTS> generator expression in its sources list.  "
              "This content was not previously part of the SOURCES property "
              "when that property was read at configure time.  Code reading "
              "that property needs to be adapted to ignore the generator "
              "expression using the string(GENEX_STRIP) command.";
              context->IssueMessage(messageType, e.str());
              }
            if (addContent)
              {
              ss << sep;
              sep = ";";
              ss << *li;
              }
            }
          else if (cmGeneratorExpression::Find(*li) == std::string::npos)
            {
            ss << sep;
            sep = ";";
            ss << *li;
            }
          else
            {
            cmSourceFile *sf = this->Makefile->GetOrCreateSource(*li);
            // Construct what is known about this source file location.
            cmSourceFileLocation const& location = sf->GetLocation();
            std::string sname = location.GetDirectory();
            if(!sname.empty())
              {
              sname += "/";
              }
            sname += location.GetName();

            ss << sep;
            sep = ";";
            // Append this list entry.
            ss << sname;
            }
          }
        }
      this->Properties.SetProperty("SOURCES", ss.str().c_str());
      }
    }

  const char *retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal)
    {
    const bool chain = this->GetMakefile()->GetState()->
                      IsPropertyChained(prop, cmProperty::TARGET);
    if (chain)
      {
      return this->Makefile->GetProperty(prop, chain);
      }
    }
  return retVal;
}